

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::position_to_line(Fl_Text_Display *this,int pos,int *lineNum)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  uint unaff_EBP;
  
  uVar3 = 0;
  bVar1 = false;
  while( true ) {
    *lineNum = 0;
    if (pos < this->mFirstChar) break;
    uVar4 = (ulong)(uint)this->mNVisibleLines;
    iVar2 = this->mLastChar;
    if (pos <= iVar2) {
      piVar5 = this->mLineStarts + uVar4;
      goto LAB_001d24c7;
    }
    if ((this->mNVisibleLines < 1) || (this->mLineStarts[uVar4 - 1] != -1)) break;
    if (iVar2 < this->mBuffer->mLength) {
      iVar2 = position_to_line(this,iVar2,lineNum);
      if (iVar2 == 0) {
        (*Fl::error)("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
        uVar3 = 0;
      }
      else {
        iVar2 = *lineNum;
        *lineNum = iVar2 + 1;
        uVar3 = (uint)(iVar2 < this->mNVisibleLines + -1);
      }
      break;
    }
    pos = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,iVar2);
    if (!bVar1) {
      unaff_EBP = 1;
    }
    bVar1 = true;
  }
  goto LAB_001d2530;
  while( true ) {
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    if (*piVar5 <= pos && *piVar5 != -1) break;
LAB_001d24c7:
    piVar5 = piVar5 + -1;
    uVar3 = 0;
    if ((int)uVar4 < 1) goto LAB_001d2530;
  }
  *lineNum = uVar3;
  uVar3 = 1;
LAB_001d2530:
  if (bVar1) {
    uVar3 = unaff_EBP;
  }
  return uVar3;
}

Assistant:

int Fl_Text_Display::position_to_line( int pos, int *lineNum ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int i;

  *lineNum = 0;
  if ( pos < mFirstChar ) return 0;
  if ( pos > mLastChar ) {
    if ( empty_vlines() ) {
      if ( mLastChar < mBuffer->length() ) {
        if ( !position_to_line( mLastChar, lineNum ) ) {
          Fl::error("Fl_Text_Display::position_to_line(): Consistency check ptvl failed");
          return 0;
        }
        return ++( *lineNum ) <= mNVisibleLines - 1;
      } else {
        position_to_line( buffer()->prev_char_clipped(mLastChar), lineNum );
        return 1;
      }
    }
    return 0;
  }

  for ( i = mNVisibleLines - 1; i >= 0; i-- ) {
    if ( mLineStarts[ i ] != -1 && pos >= mLineStarts[ i ] ) {
      *lineNum = i;
      return 1;
    }
  }
  return 0;   /* probably never be reached */
}